

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_curve.cpp
# Opt level: O1

bool __thiscall ON_Curve::FrameAt(ON_Curve *this,double t,ON_Plane *plane)

{
  ON_3dVector *b;
  bool bVar1;
  bool bVar2;
  double *pdVar3;
  byte bVar4;
  ON_3dVector K;
  ON_3dVector T;
  ON_3dPoint pt;
  ON_Interval domain;
  ON_3dVector d2;
  ON_3dVector d1;
  ON_3dVector local_d0;
  ON_3dVector local_b8;
  ON_3dPoint local_a0;
  ON_Interval local_88;
  ON_3dVector local_78;
  ON_3dVector local_60;
  ON_3dVector local_48;
  
  (*(this->super_ON_Geometry).super_ON_Object._vptr_ON_Object[0x25])();
  bVar1 = false;
  pdVar3 = ON_Interval::operator[](&local_88,0);
  if (*pdVar3 + -2.220446049250313e-16 <= t) {
    pdVar3 = ON_Interval::operator[](&local_88,1);
    if (t <= *pdVar3 + 2.220446049250313e-16) {
      bVar1 = Ev2Der(this,t,&local_a0,&local_48,&local_60,0,(int *)0x0);
      if (bVar1) {
        bVar1 = ON_EvCurvature(&local_48,&local_60,&local_b8,&local_d0);
        bVar4 = 1;
        if (bVar1) {
          bVar2 = ON_3dVector::Unitize(&local_d0);
          if (!bVar2) {
            ON_3dVector::PerpendicularTo(&local_d0,&local_b8);
            ON_3dVector::Unitize(&local_d0);
          }
          (plane->origin).z = local_a0.z;
          (plane->origin).x = local_a0.x;
          (plane->origin).y = local_a0.y;
          (plane->xaxis).x = local_b8.x;
          (plane->xaxis).y = local_b8.y;
          (plane->xaxis).z = local_b8.z;
          b = &plane->yaxis;
          (plane->yaxis).x = local_d0.x;
          (plane->yaxis).y = local_d0.y;
          (plane->yaxis).z = local_d0.z;
          ON_CrossProduct(&local_78,&plane->xaxis,b);
          (plane->zaxis).z = local_78.z;
          (plane->zaxis).x = local_78.x;
          (plane->zaxis).y = local_78.y;
          bVar2 = ON_3dVector::Unitize(&plane->zaxis);
          if (bVar2) {
            ON_Plane::UpdateEquation(plane);
            bVar1 = ON_Plane::IsValid(plane);
            if (!bVar1) {
              ON_CrossProduct(&local_78,&plane->zaxis,&plane->xaxis);
              (plane->yaxis).z = local_78.z;
              b->x = local_78.x;
              (plane->yaxis).y = local_78.y;
              ON_3dVector::Unitize(b);
              bVar1 = ON_Plane::UpdateEquation(plane);
            }
          }
          else {
            bVar4 = 0;
          }
        }
        bVar1 = (bool)(bVar1 & bVar4);
      }
    }
    else {
      bVar1 = false;
    }
  }
  return bVar1;
}

Assistant:

bool ON_Curve::FrameAt( double t, ON_Plane& plane) const
{
  bool rc = false;
  ON_Interval domain = Domain();
  if( t < domain[0] - ON_EPSILON || t > domain[1] + ON_EPSILON)
    return false;

  ON_3dPoint pt;
  ON_3dVector d1, d2;
  rc = Ev2Der( t, pt, d1, d2 );
  if (rc)
  {
    ON_3dVector T, K;
    rc = ON_EvCurvature(d1, d2, T, K);
    if (rc)
    {
      if (!K.Unitize())
      {
        K.PerpendicularTo(T);
        K.Unitize();
      }
      plane.origin = pt;
      plane.xaxis = T;
      plane.yaxis = K;
      plane.zaxis = ON_CrossProduct(plane.xaxis, plane.yaxis);
      if (!plane.zaxis.Unitize())
        return false;
      plane.UpdateEquation();
      rc = plane.IsValid();
      if (!rc)
      {
        //26 Aug 2015 - Chuck - If K is extremely short, but can still be unitized, the result may not be perpendicular to T.
        plane.yaxis = ON_CrossProduct(plane.zaxis, plane.xaxis);
        plane.yaxis.Unitize();
        rc = plane.UpdateEquation();
      }
    }
  }
  return rc;
}